

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl,GLint pname)

{
  RenderContext *context;
  SupportedTextureType *pSVar1;
  bool bVar2;
  GLenum GVar3;
  TypedObjectWrapper<(glu::ObjectType)7> *this_00;
  Texture2D *this_01;
  pointer ppSVar4;
  pointer pSVar5;
  GLint pname_local;
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> texture;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  pname_local = pname;
  this_00 = (TypedObjectWrapper<(glu::ObjectType)7> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper(this_00,context);
  sampler.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  .m_data.ptr = this_00;
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x24e);
  (*gl->samplerParameteri)
            (((sampler.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
               .m_data.ptr)->super_ObjectWrapper).m_object,0x9366,pname_local);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"samplerParameteri error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x251);
  for (ppSVar4 = (this->m_utils).m_supportedTextureTypes.
                 super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar4 !=
      (this->m_utils).m_supportedTextureTypes.
      super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    pSVar1 = *ppSVar4;
    (*gl->texParameteriv)(pSVar1->m_type,0x9366,&pname_local);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"texParameteriv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x259);
    (*gl->texParameterIiv)(pSVar1->m_type,0x9366,&pname_local);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"texParameterIiv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x25c);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_ES3_1_compatibility")
  ;
  for (pSVar5 = (this->m_utils).m_supportedTextureDataTypes.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 != (this->m_utils).m_supportedTextureDataTypes.
                super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
    if ((byte)(~bVar2 & ((byte)pSVar5->m_testFlags & 2) >> 1) == 0) {
      this_01 = (Texture2D *)operator_new(0x70);
      glu::Texture2D::Texture2D(this_01,context,pSVar5->m_format,pSVar5->m_type,0x20,0x20);
      texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr =
           this_01;
      (*this_01->_vptr_Texture2D[2])(this_01);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glu::Texture2D error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x26a);
      (*gl->textureParameteriv)
                ((texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                  m_data.ptr)->m_glTexture,0x9366,&pname_local);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"textureParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x26d);
      (*gl->textureParameterIiv)
                ((texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                  m_data.ptr)->m_glTexture,0x9366,&pname_local);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"textureParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x270);
      de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~UniqueBase
                (&texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
    }
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::~UniqueBase(&sampler.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
               );
  return;
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries(const glw::Functions& gl, glw::GLint pname)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	gl.samplerParameteri(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, pname);
	GLU_EXPECT_NO_ERROR(gl.getError(), "samplerParameteri error occurred");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.texParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteriv error occurred");

		gl.texParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameterIiv error occurred");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.textureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameteriv error occurred");

		gl.textureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameterIiv error occurred");
	}
}